

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_tctable_lite.cc
# Opt level: O1

char * google::protobuf::internal::TcParser::SingularVarBigint<bool,unsigned_short,false>
                 (MessageLite *msg,char *ptr,ParseContext *ctx,TcFieldData data,
                 TcParseTableBase *table,uint64_t hasbits)

{
  uint uVar1;
  ushort *puVar2;
  char *pcVar3;
  TcFieldData TVar4;
  ulong uVar5;
  uint *puVar6;
  ulong uVar7;
  bool bVar8;
  Spill spill;
  
  TVar4.field_0 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)(long)*ptr;
  if (-1 < (long)TVar4.field_0) {
    protobuf_assumption_failed
              ("static_cast<int8_t>(*ptr) < 0",
               "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/protobuf-src/src/google/protobuf/generated_message_tctable_lite.cc"
               ,0x31c);
  }
  uVar5 = (long)ptr[1] << 7 | 0x7f;
  if ((long)uVar5 < 0) {
    uVar7 = (long)ptr[2] << 0xe | 0x3fff;
    if ((long)uVar7 < 0) {
      uVar5 = uVar5 & ((long)ptr[3] << 0x15 | 0x1fffffU);
      if ((long)uVar5 < 0) {
        uVar7 = uVar7 & ((long)ptr[4] << 0x1c | 0xfffffffU);
        if ((long)uVar7 < 0) {
          uVar5 = uVar5 & ((long)ptr[5] << 0x23 | 0x7ffffffffU);
          if ((long)uVar5 < 0) {
            uVar7 = uVar7 & ((long)ptr[6] << 0x2a | 0x3ffffffffffU);
            if ((long)uVar7 < 0) {
              uVar5 = uVar5 & ((long)ptr[7] << 0x31 | 0x1ffffffffffffU);
              if ((long)uVar5 < 0) {
                uVar7 = uVar7 & ((ulong)(byte)ptr[8] << 0x38 | 0xffffffffffffff);
                if ((long)uVar7 < 0) {
                  puVar2 = (ushort *)(ptr + 10);
                  if (ptr[9] != '\x01') {
                    if (ptr[9] < '\0') {
                      bVar8 = true;
                      puVar2 = (ushort *)0x0;
                      goto LAB_002a71d1;
                    }
                    if ((ptr[9] & 1U) == 0) {
                      uVar7 = uVar7 ^ 0x8000000000000000;
                    }
                  }
                }
                else {
                  puVar2 = (ushort *)(ptr + 9);
                }
              }
              else {
                puVar2 = (ushort *)(ptr + 8);
              }
            }
            else {
              puVar2 = (ushort *)(ptr + 7);
            }
          }
          else {
            puVar2 = (ushort *)(ptr + 6);
          }
        }
        else {
          puVar2 = (ushort *)(ptr + 5);
        }
      }
      else {
        puVar2 = (ushort *)(ptr + 4);
      }
    }
    else {
      puVar2 = (ushort *)(ptr + 3);
    }
    uVar5 = uVar5 & uVar7;
  }
  else {
    puVar2 = (ushort *)(ptr + 2);
  }
  bVar8 = (uVar5 & (ulong)TVar4.field_0) != 0;
LAB_002a71d1:
  if (puVar2 == (ushort *)0x0) {
    pcVar3 = Error(msg,(char *)0x0,ctx,TVar4,table,hasbits);
    return pcVar3;
  }
  *(bool *)((long)&msg->_vptr_MessageLite + ((ulong)data.field_0 >> 0x30)) = bVar8;
  if ((ctx->super_EpsCopyInputStream).limit_end_ <= puVar2) {
    if ((ulong)table->has_bits_offset != 0) {
      puVar6 = (uint *)((long)&msg->_vptr_MessageLite + (ulong)table->has_bits_offset);
      if (((ulong)puVar6 & 3) != 0) {
        AlignFail();
      }
      *puVar6 = *puVar6 | (uint)hasbits;
    }
    return (char *)puVar2;
  }
  uVar1 = (uint)table->fast_idx_mask & (uint)*puVar2;
  if ((uVar1 & 7) != 0) {
    protobuf_assumption_failed
              ("(idx & 7) == 0",
               "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/protobuf-src/src/google/protobuf/generated_message_tctable_impl.h"
               ,0x44d);
  }
  pcVar3 = (char *)(**(code **)(&table[1].has_bits_offset + (uVar1 & 0xfffffff8)))();
  return pcVar3;
}

Assistant:

PROTOBUF_NOINLINE const char* TcParser::SingularVarBigint(
    PROTOBUF_TC_PARAM_DECL) {
  // For some reason clang wants to save 5 registers to the stack here,
  // but we only need four for this code, so save the data we don't need
  // to the stack.  Happily, saving them this way uses regular store
  // instructions rather than PUSH/POP, which saves time at the cost of greater
  // code size, but for this heavily-used piece of code, that's fine.
  struct Spill {
    uint64_t field_data;
    ::google::protobuf::MessageLite* msg;
    const ::google::protobuf::internal::TcParseTableBase* table;
    uint64_t hasbits;
  };
  Spill spill = {data.data, msg, table, hasbits};
#if defined(__GNUC__)
  // This empty asm block convinces the compiler that the contents of spill may
  // have changed, and thus can't be cached in registers.  It's similar to, but
  // more optimal than, the effect of declaring it "volatile".
  asm("" : "+m"(spill));
#endif

  uint64_t tmp;
  PROTOBUF_ASSUME(static_cast<int8_t>(*ptr) < 0);
  ptr = ParseVarint(ptr, &tmp);

  data.data = spill.field_data;
  msg = spill.msg;
  table = spill.table;
  hasbits = spill.hasbits;

  if (PROTOBUF_PREDICT_FALSE(ptr == nullptr)) {
    PROTOBUF_MUSTTAIL return Error(PROTOBUF_TC_PARAM_NO_DATA_PASS);
  }
  RefAt<FieldType>(msg, data.offset()) =
      ZigZagDecodeHelper<FieldType, zigzag>(tmp);
  PROTOBUF_MUSTTAIL return ToTagDispatch(PROTOBUF_TC_PARAM_NO_DATA_PASS);
}